

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O1

symbol * restricted_binop_type
                   (dmr_C *C,int op,expression *left,expression *right,int lclass,int rclass,
                   symbol *ltype,symbol *rtype)

{
  uint uVar1;
  symbol *psVar2;
  symbol *psVar3;
  undefined4 in_register_00000034;
  undefined4 in_register_0000008c;
  
  if (((ulong)right & 4) == 0) {
    if (*(char *)CONCAT44(in_register_00000034,op) == '\x01') {
      psVar3 = (symbol *)0x0;
      if (*(long *)(CONCAT44(in_register_00000034,op) + 0x20) == 0) {
        psVar3 = ltype;
      }
      goto LAB_0010f78c;
    }
  }
  else {
    psVar2 = (symbol *)CONCAT44(in_register_0000008c,rclass);
    psVar3 = psVar2;
    if ((lclass & 4U) == 0) {
      if (*(char *)left == '\x01') {
        if ((left->field_5).field_0.value != 0) {
          psVar3 = (symbol *)0x0;
        }
        goto LAB_0010f78c;
      }
    }
    else {
      if (psVar2 == ltype) goto LAB_0010f78c;
      if (((ulong)right & 0x40) != 0) {
        if ((psVar2->field_14).field_2.ctype.base_type != ltype) {
          psVar3 = (symbol *)0x0;
        }
        goto LAB_0010f78c;
      }
      if ((lclass & 0x40U) != 0) {
        psVar3 = (symbol *)0x0;
        if ((ltype->field_14).field_2.ctype.base_type == psVar2) {
          psVar3 = ltype;
        }
        goto LAB_0010f78c;
      }
    }
  }
  psVar3 = (symbol *)0x0;
LAB_0010f78c:
  if (psVar3 == (symbol *)0x0) {
    return (symbol *)0x0;
  }
  uVar1 = restricted_binop((int)C);
  psVar2 = (symbol *)(*(code *)(&DAT_001378e8 + *(int *)(&DAT_001378e8 + (ulong)uVar1 * 4)))();
  return psVar2;
}

Assistant:

static struct symbol *restricted_binop_type(struct dmr_C *C, int op,
					struct expression *left,
					struct expression *right,
					int lclass, int rclass,
					struct symbol *ltype,
					struct symbol *rtype)
{
        (void) C;
	struct symbol *ctype = NULL;
	if (lclass & TYPE_RESTRICT) {
		if (rclass & TYPE_RESTRICT) {
			if (ltype == rtype) {
				ctype = ltype;
			} else if (lclass & TYPE_FOULED) {
				if (unfoul(ltype) == rtype)
					ctype = ltype;
			} else if (rclass & TYPE_FOULED) {
				if (unfoul(rtype) == ltype)
					ctype = rtype;
			}
		} else {
			if (!restricted_value(right, ltype))
				ctype = ltype;
		}
	} else if (!restricted_value(left, rtype))
		ctype = rtype;

	if (ctype) {
		switch (restricted_binop(op)) {
		case 1:
			if ((lclass ^ rclass) & TYPE_FOULED)
				ctype = unfoul(ctype);
			break;
		case 3:
			if (!(lclass & rclass & TYPE_FOULED))
				break;
		case 0:
			ctype = NULL;
		default:
			break;
		}
	}

	return ctype;
}